

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

string_type * __thiscall
jsoncons::basic_json_options_common<wchar_t>::neginf_to_num_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_json_options_common<wchar_t> *this)

{
  string_type *s;
  
  if ((*(ushort *)&this->field_0x8 & 6) == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::wstring::wstring
              ((wstring *)__return_storage_ptr__,(wstring *)&this->neginf_to_num_);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type neginf_to_num() const
    {
        if (enable_neginf_to_num_)
        {
            return neginf_to_num_;
        }
        else if (enable_inf_to_num_)
        {
            string_type s;
            s.push_back('-');
            s.append(inf_to_num_);
            return s;
        }
        else
        {
            return neginf_to_num_; // empty string
        }
    }